

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.c
# Opt level: O0

sysbvm_tuple_t sysbvm_tuple_slotAt(sysbvm_context_t *context,sysbvm_tuple_t tuple,size_t slotIndex)

{
  _Bool _Var1;
  sysbvm_tuple_t sVar2;
  size_t sVar3;
  sysbvm_tuple_t byteValue;
  size_t slotIndex_local;
  sysbvm_tuple_t tuple_local;
  sysbvm_context_t *context_local;
  
  _Var1 = sysbvm_tuple_isDummyValue(tuple);
  if (_Var1) {
    sysbvm_error_accessDummyValue();
  }
  _Var1 = sysbvm_tuple_isNonNullPointer(tuple);
  if (_Var1) {
    _Var1 = sysbvm_tuple_isBytes(tuple);
    if (_Var1) {
      sVar3 = sysbvm_tuple_getSizeInBytes(tuple);
      if (slotIndex < sVar3) {
        sVar2 = sysbvm_tuple_uint8_encode(*(uint8_t *)(tuple + 0x10 + slotIndex));
        return sVar2;
      }
    }
    else {
      sVar3 = sysbvm_tuple_getSizeInSlots(tuple);
      if (slotIndex < sVar3) {
        return *(sysbvm_tuple_t *)(tuple + 0x10 + slotIndex * 8);
      }
    }
    sysbvm_error_outOfBoundsSlotAccess();
    context_local = (sysbvm_context_t *)0x0;
  }
  else if (slotIndex < 8) {
    context_local =
         (sysbvm_context_t *)
         sysbvm_tuple_uint8_encode((uint8_t)((long)tuple >> ((char)(slotIndex << 3) + 4U & 0x3f)));
  }
  else {
    context_local = (sysbvm_context_t *)0x0;
  }
  return (sysbvm_tuple_t)context_local;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_tuple_slotAt(sysbvm_context_t *context, sysbvm_tuple_t tuple, size_t slotIndex)
{
    (void)context;
    if(sysbvm_tuple_isDummyValue(tuple)) sysbvm_error_accessDummyValue();

    if(!sysbvm_tuple_isNonNullPointer(tuple))
    {
        if(slotIndex < sizeof(sysbvm_tuple_t))
        {
            sysbvm_tuple_t byteValue = ( ((sysbvm_stuple_t)tuple) >> (SYSBVM_TUPLE_TAG_BIT_COUNT + slotIndex*8)) & 0xFF;
            return sysbvm_tuple_uint8_encode((uint8_t)byteValue);
        }

        return SYSBVM_NULL_TUPLE;
    }

    if(sysbvm_tuple_isBytes(tuple))
    {
        if(slotIndex < sysbvm_tuple_getSizeInBytes(tuple))
            return sysbvm_tuple_uint8_encode(SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(tuple)->bytes[slotIndex]);
    }
    else
    {
        if(slotIndex < sysbvm_tuple_getSizeInSlots(tuple))
            return SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(tuple)->pointers[slotIndex];
    }

    sysbvm_error_outOfBoundsSlotAccess();
    return SYSBVM_NULL_TUPLE;
}